

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KMeans.cpp
# Opt level: O1

void __thiscall KMeans::KMeans(KMeans *this,shared_ptr<Launcher> *launcher,size_t k,size_t kappa)

{
  _WordT *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  TreeDecomposition *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  size_t sVar6;
  Attribute *pAVar7;
  TDNode *pTVar8;
  mapped_type *pmVar9;
  ulong uVar10;
  ulong uVar11;
  _Alloc_hider _Var12;
  ulong uVar13;
  ulong attID;
  size_t clusterID;
  element_type *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (this->super_Application)._listOfFeatures.super__Vector_base<Feature,_std::allocator<Feature>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Application)._listOfFeatures.super__Vector_base<Feature,_std::allocator<Feature>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Application)._isCategoricalFeature.super__Base_bitset<2UL>._M_w[0] = 0;
  (this->super_Application)._isCategoricalFeature.super__Base_bitset<2UL>._M_w[1] = 0;
  (this->super_Application)._isFeature.super__Base_bitset<2UL>._M_w[0] = 0;
  (this->super_Application)._isFeature.super__Base_bitset<2UL>._M_w[1] = 0;
  (this->super_Application)._features.super__Base_bitset<2UL>._M_w[0] = 0;
  (this->super_Application)._features.super__Base_bitset<2UL>._M_w[1] = 0;
  (this->super_Application)._listOfFeatures.super__Vector_base<Feature,_std::allocator<Feature>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Application)._vptr_Application = (_func_int **)&PTR__KMeans_002dabd8;
  (this->_pathToFiles)._M_dataplus._M_p = (pointer)&(this->_pathToFiles).field_2;
  (this->_pathToFiles)._M_string_length = 0;
  (this->_pathToFiles).field_2._M_local_buf[0] = '\0';
  (this->_launcher).super___shared_ptr<Launcher,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (launcher->super___shared_ptr<Launcher,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (launcher->super___shared_ptr<Launcher,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (this->_launcher).super___shared_ptr<Launcher,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_k = k;
  this->_dimensionK = kappa;
  this->_queryRootIndex = (size_t *)0x0;
  (this->clusterVariables).super__Base_bitset<2UL>._M_w[0] = 0;
  (this->clusterVariables).super__Base_bitset<2UL>._M_w[1] = 0;
  (this->categoricalQueries).
  super__Vector_base<std::pair<unsigned_long,_Query_*>,_std::allocator<std::pair<unsigned_long,_Query_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->categoricalQueries).
  super__Vector_base<std::pair<unsigned_long,_Query_*>,_std::allocator<std::pair<unsigned_long,_Query_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->categoricalQueries).
  super__Vector_base<std::pair<unsigned_long,_Query_*>,_std::allocator<std::pair<unsigned_long,_Query_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->continuousQueries).
  super__Vector_base<std::pair<unsigned_long,_Query_*>,_std::allocator<std::pair<unsigned_long,_Query_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->continuousQueries).
  super__Vector_base<std::pair<unsigned_long,_Query_*>,_std::allocator<std::pair<unsigned_long,_Query_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->continuousQueries).
  super__Vector_base<std::pair<unsigned_long,_Query_*>,_std::allocator<std::pair<unsigned_long,_Query_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Launcher::getCompiler((launcher->super___shared_ptr<Launcher,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
  ;
  p_Var5 = p_Stack_80;
  peVar4 = local_88;
  local_88 = (element_type *)0x0;
  p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)peVar4;
  (this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var5;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
  }
  Launcher::getTreeDecomposition
            ((launcher->super___shared_ptr<Launcher,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  p_Var5 = p_Stack_80;
  peVar4 = local_88;
  local_88 = (element_type *)0x0;
  p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  (this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
  (this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var5;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
  }
  loadFeatures(this);
  sVar6 = TreeDecomposition::numberOfAttributes
                    ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  this->numberOfOriginalVariables = sVar6;
  attID = 0;
  do {
    uVar13 = attID >> 6;
    uVar11 = 1L << ((byte)attID & 0x3f);
    if (((this->super_Application)._isFeature.super__Base_bitset<2UL>._M_w[uVar13] >> (attID & 0x3f)
        & 1) != 0) {
      pAVar7 = TreeDecomposition::getAttribute
                         ((this->_td).
                          super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          attID);
      pTVar8 = TreeDecomposition::getRelation
                         ((this->_td).
                          super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          this->_queryRootIndex[attID]);
      this_00 = (this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      if (((this->super_Application)._isCategoricalFeature.super__Base_bitset<2UL>._M_w[uVar13] &
          uVar11) == 0) {
        std::operator+(&local_70,"cluster_",&pAVar7->_name);
        TreeDecomposition::addAttribute
                  (this_00,&local_70,Double,(pair<bool,_double>)ZEXT816(1),pTVar8->_id);
        pbVar3 = &local_70;
        _Var12._M_p = local_70._M_dataplus._M_p;
      }
      else {
        std::operator+(&local_50,"cluster_",&pAVar7->_name);
        TreeDecomposition::addAttribute
                  (this_00,&local_50,Integer,(pair<bool,_double>)ZEXT816(1),pTVar8->_id);
        pbVar3 = &local_50;
        _Var12._M_p = local_50._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var12._M_p != &pbVar3->field_2) {
        operator_delete(_Var12._M_p);
      }
      sVar6 = TreeDecomposition::numberOfAttributes
                        ((this->_td).
                         super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      local_88 = (element_type *)(sVar6 - 1);
      if ((element_type *)0x63 < local_88) {
        std::__throw_out_of_range_fmt
                  ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",local_88,100)
        ;
      }
      uVar10 = 1L << ((byte)local_88 & 0x3f);
      p_Var1 = (this->clusterVariables).super__Base_bitset<2UL>._M_w + ((ulong)local_88 >> 6);
      *p_Var1 = *p_Var1 | uVar10;
      if (((this->super_Application)._isCategoricalFeature.super__Base_bitset<2UL>._M_w[uVar13] &
          uVar11) != 0) {
        p_Var1 = (this->super_Application)._isCategoricalFeature.super__Base_bitset<2UL>._M_w +
                 ((ulong)local_88 >> 6);
        *p_Var1 = *p_Var1 | uVar10;
      }
      pmVar9 = std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&clusterToVariableMap,(key_type *)&local_88);
      *pmVar9 = attID;
    }
    attID = attID + 1;
    if (attID == 100) {
      return;
    }
  } while( true );
}

Assistant:

KMeans::KMeans(std::shared_ptr<Launcher> launcher, const size_t k, const size_t kappa) :
    _launcher(launcher), _k(k), _dimensionK(kappa)
{
    _compiler = launcher->getCompiler();
    _td = launcher->getTreeDecomposition();

    // This should be modified in case you want to a different k for each dimension
    // _dimensionK = _k;
    
    loadFeatures();

    numberOfOriginalVariables = _td->numberOfAttributes();

    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (!_isFeature[var])
            continue;

        Attribute* att = _td->getAttribute(var);
        TDNode* node = _td->getRelation(_queryRootIndex[var]);

        if (_isCategoricalFeature[var]) 
            _td->addAttribute("cluster_"+att->_name,Type::Integer,{true,0.0},node->_id);
        else
            _td->addAttribute("cluster_"+att->_name,Type::Double,{true,0.0},node->_id);
            
        size_t clusterID = _td->numberOfAttributes()-1;
        
        clusterVariables.set(clusterID);

        if (_isCategoricalFeature[var])
            _isCategoricalFeature.set(clusterID);

        clusterToVariableMap[clusterID] = var;   
    }
}